

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

QList<QByteArrayView> * __thiscall
QTimeZonePrivate::matchingTimeZoneIds
          (QList<QByteArrayView> *__return_storage_ptr__,QTimeZonePrivate *this,Territory territory)

{
  undefined6 in_register_00000012;
  long lVar1;
  long in_FS_OFFSET;
  iterator __begin4;
  QByteArrayView local_a8;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArrayView *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((int)CONCAT62(in_register_00000012,territory) == 0x102) {
    for (lVar1 = 0; lVar1 != 0x684; lVar1 = lVar1 + 0xc) {
      local_98._0_16_ =
           (undefined1  [16])
           QtTimeZoneCldr::WindowsData::ianaId
                     ((WindowsData *)((long)&QtTimeZoneCldr::windowsDataTable + lVar1));
      QList<QByteArrayView>::emplaceBack<QByteArrayView>
                (__return_storage_ptr__,(QByteArrayView *)local_98);
    }
  }
  else {
    for (lVar1 = 0; lVar1 != 0x876; lVar1 = lVar1 + 6) {
      if (*(Territory *)(&DAT_00532fd2 + lVar1) == territory) {
        local_58.m_haystack =
             QtTimeZoneCldr::ZoneData::id
                       ((ZoneData *)((long)&QtTimeZoneCldr::zoneDataTable + lVar1));
        local_58.super_QStringTokenizerBaseBase.m_sb.
        super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
        super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
             (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
        local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
        local_58.m_needle.ucs = L' ';
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator
                  ((iterator *)local_98,&local_58);
        while (local_98[0x18] != false) {
          local_a8.m_size = local_98._8_8_;
          local_a8.m_data = (storage_type *)local_98._16_8_;
          QList<QByteArrayView>::emplaceBack<QByteArrayView>(__return_storage_ptr__,&local_a8);
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArrayView> QTimeZonePrivate::matchingTimeZoneIds(QLocale::Territory territory) const
{
    // Default fall-back mode: use the CLDR data to find zones for this territory.
    QList<QByteArrayView> regions;
#if QT_CONFIG(timezone_locale) && !QT_CONFIG(icu)
    regions = QtTimeZoneLocale::ianaIdsForTerritory(territory);
#endif
    // Get all Zones in the table associated with this territory:
    if (territory == QLocale::World) {
        // World names are filtered out of zoneDataTable to provide the defaults
        // in windowsDataTable.
        for (const WindowsData &data : windowsDataTable)
            regions << data.ianaId();
    } else {
        for (const ZoneData &data : zoneDataTable) {
            if (data.territory == territory) {
                for (auto l1 : data.ids())
                    regions << QByteArrayView(l1.data(), l1.size());
            }
        }
    }
    return regions;
}